

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_pop_level(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  size_t sVar6;
  Parser *in_RDI;
  Parser *in_stack_00000010;
  char msg [35];
  undefined4 in_stack_fffffffffffffee8;
  flag_t in_stack_fffffffffffffeec;
  Parser *in_stack_fffffffffffffef0;
  stack<c4::yml::Parser::State,_16UL> *in_stack_fffffffffffffef8;
  Location *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  Location *in_stack_ffffffffffffff10;
  stack<c4::yml::Parser::State,_16UL> *psVar7;
  undefined8 local_d0;
  Parser *in_stack_ffffffffffffff38;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffff40;
  Location *pLStack_b8;
  size_t in_stack_ffffffffffffff50;
  Parser *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60 [24];
  Parser *in_stack_ffffffffffffff88;
  undefined8 local_48;
  Parser *pPStack_40;
  
  bVar3 = has_any(in_RDI,4);
  if (!bVar3) {
    in_stack_ffffffffffffff88 = (Parser *)in_RDI->m_state->node_id;
    pNVar5 = Tree::_p((Tree *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    if (((pNVar5->m_type).type & MAP) == NOTYPE) goto LAB_0033787a;
  }
  _stop_map(in_stack_ffffffffffffff88);
LAB_0033787a:
  bVar3 = has_any(in_RDI,8);
  if ((bVar3) ||
     (pNVar5 = Tree::_p((Tree *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38),
     ((pNVar5->m_type).type & SEQ) != NOTYPE)) {
    _stop_seq(in_stack_ffffffffffffff88);
  }
  pNVar5 = Tree::_p((Tree *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  if (((pNVar5->m_type).type & DOC) != NOTYPE) {
    _stop_doc(in_stack_00000010);
  }
  sVar6 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack);
  if (sVar6 < 2) {
    memcpy(&stack0xffffffffffffff58,"check failed: (m_stack.size() > 1)",0x23);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       (size_t)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                       (size_t)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffef8 = in_stack_ffffffffffffff40;
    in_stack_fffffffffffffef0 = in_stack_ffffffffffffff38;
    in_stack_fffffffffffffee8 = (undefined4)local_d0;
    in_stack_fffffffffffffeec = (flag_t)((ulong)local_d0 >> 0x20);
    LVar2.super_LineCol.line = (size_t)in_stack_fffffffffffffef0;
    LVar2.super_LineCol.offset = local_d0;
    LVar2.super_LineCol.col = (size_t)in_stack_fffffffffffffef8;
    LVar2.name.str = (char *)pLStack_b8;
    LVar2.name.len = in_stack_ffffffffffffff50;
    in_stack_ffffffffffffff40 = in_stack_fffffffffffffef8;
    (*p_Var1)(&stack0xffffffffffffff58,0x23,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_ffffffffffffff00 = pLStack_b8;
  }
  _prepare_pop(in_stack_ffffffffffffff58);
  detail::stack<c4::yml::Parser::State,_16UL>::pop(in_stack_ffffffffffffff40);
  psVar7 = &in_RDI->m_stack;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                       (size_t)in_stack_fffffffffffffef0,
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    in_stack_fffffffffffffeec = (flag_t)((ulong)local_48 >> 0x20);
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff58;
    loc.super_LineCol.offset = in_stack_ffffffffffffff50;
    loc.super_LineCol.col = in_stack_ffffffffffffff60._0_8_;
    loc.name.str = (char *)SUB168(in_stack_ffffffffffffff60._8_16_,0);
    loc.name.len = SUB168(in_stack_ffffffffffffff60._8_16_,8);
    error<25ul>((char (*) [25])in_stack_ffffffffffffff40,loc);
    in_stack_fffffffffffffef0 = pPStack_40;
  }
  in_RDI->m_state = psVar7->m_stack + (psVar7->m_size - 1);
  if ((in_RDI->m_state->line_contents).indentation == 0) {
    add_flags(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  }
  return;
}

Assistant:

void Parser::_pop_level()
{
    _c4dbgpf("popping level! currnode={} currlevel={}", m_state->node_id, m_state->level);
    if(has_any(RMAP) || m_tree->is_map(m_state->node_id))
    {
        _stop_map();
    }
    if(has_any(RSEQ) || m_tree->is_seq(m_state->node_id))
    {
        _stop_seq();
    }
    if(m_tree->is_doc(m_state->node_id))
    {
        _stop_doc();
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() > 1);
    _prepare_pop();
    m_stack.pop();
    m_state = &m_stack.top();
    /*if(has_any(RMAP))
    {
        _toggle_key_val();
    }*/
    if(m_state->line_contents.indentation == 0)
    {
        //_RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RTOP));
        add_flags(RTOP);
    }
    _c4dbgpf("popping level: now, currnode={} currlevel={}", m_state->node_id, m_state->level);
}